

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SegmentInfo::Finalize(SegmentInfo *this,IMkvWriter *writer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  IMkvWriter *in_RSI;
  double *in_RDI;
  int64_t pos;
  uint64 type;
  
  if (in_RSI == (IMkvWriter *)0x0) {
    return false;
  }
  if ((0.0 < *in_RDI) && (uVar2 = (*in_RSI->_vptr_IMkvWriter[3])(), (uVar2 & 1) != 0)) {
    if (in_RDI[5] == -NAN) {
      return false;
    }
    iVar3 = (*in_RSI->_vptr_IMkvWriter[1])();
    type = CONCAT44(extraout_var,iVar3);
    iVar3 = (*in_RSI->_vptr_IMkvWriter[2])(in_RSI,in_RDI[5]);
    if (iVar3 != 0) {
      return false;
    }
    bVar1 = WriteEbmlElement(in_RSI,type,(float)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      return false;
    }
    iVar3 = (*in_RSI->_vptr_IMkvWriter[2])(in_RSI,type);
    if (iVar3 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SegmentInfo::Finalize(IMkvWriter* writer) const {
  if (!writer)
    return false;

  if (duration_ > 0.0) {
    if (writer->Seekable()) {
      if (duration_pos_ == -1)
        return false;

      const int64_t pos = writer->Position();

      if (writer->Position(duration_pos_))
        return false;

      if (!WriteEbmlElement(writer, libwebm::kMkvDuration,
                            static_cast<float>(duration_)))
        return false;

      if (writer->Position(pos))
        return false;
    }
  }

  return true;
}